

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmCommonTargetGenerator::AppendFortranFormatFlags
          (cmCommonTargetGenerator *this,string *flags,cmSourceFile *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmLocalCommonGenerator *pcVar3;
  bool bVar4;
  FortranFormat FVar5;
  string *psVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *pcVar7;
  string_view value;
  string_view value_00;
  string srcfmt;
  allocator<char> local_69;
  string local_68;
  long *local_48;
  cmOutputConverter *local_40;
  long local_38 [2];
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Fortran_FORMAT","");
  psVar6 = cmSourceFile::GetSafeProperty(source,&local_68);
  pcVar2 = (psVar6->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + psVar6->_M_string_length);
  pcVar7 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    pcVar7 = extraout_RDX_00;
  }
  value._M_str = pcVar7;
  value._M_len = (size_t)local_48;
  FVar5 = cmOutputConverter::GetFortranFormat(local_40,value);
  if (FVar5 == FortranFormatNone) {
    this_00 = this->GeneratorTarget;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Fortran_FORMAT","");
    psVar6 = cmGeneratorTarget::GetSafeProperty(this_00,&local_68);
    pcVar7 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      pcVar7 = extraout_RDX_02;
    }
    value_00._M_str = pcVar7;
    value_00._M_len = (size_t)(psVar6->_M_dataplus)._M_p;
    FVar5 = cmOutputConverter::GetFortranFormat
                      ((cmOutputConverter *)psVar6->_M_string_length,value_00);
  }
  if (FVar5 == FortranFormatFree) {
    pcVar7 = "CMAKE_Fortran_FORMAT_FREE_FLAG";
  }
  else {
    if (FVar5 != FortranFormatFixed) {
      bVar4 = true;
      pcVar7 = (char *)0x0;
      goto LAB_00372f3a;
    }
    pcVar7 = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
  }
  bVar4 = false;
LAB_00372f3a:
  if (!bVar4) {
    this_01 = this->Makefile;
    pcVar3 = this->LocalCommonGenerator;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar7,&local_69);
    psVar6 = cmMakefile::GetSafeDefinition(this_01,&local_68);
    (*(pcVar3->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar3,flags,psVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendFortranFormatFlags(
  std::string& flags, cmSourceFile const& source)
{
  const std::string srcfmt = source.GetSafeProperty("Fortran_FORMAT");
  cmOutputConverter::FortranFormat format =
    cmOutputConverter::GetFortranFormat(srcfmt);
  if (format == cmOutputConverter::FortranFormatNone) {
    std::string const& tgtfmt =
      this->GeneratorTarget->GetSafeProperty("Fortran_FORMAT");
    format = cmOutputConverter::GetFortranFormat(tgtfmt);
  }
  const char* var = nullptr;
  switch (format) {
    case cmOutputConverter::FortranFormatFixed:
      var = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
      break;
    case cmOutputConverter::FortranFormatFree:
      var = "CMAKE_Fortran_FORMAT_FREE_FLAG";
      break;
    default:
      break;
  }
  if (var) {
    this->LocalCommonGenerator->AppendFlags(
      flags, this->Makefile->GetSafeDefinition(var));
  }
}